

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedDataCollection::Merge(BatchedDataCollection *this,BatchedDataCollection *other)

{
  _Rb_tree_node_base *__k;
  iterator iVar1;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this_00;
  _Base_ptr p_Var2;
  InternalException *this_01;
  allocator local_59;
  BatchedDataCollection *local_58;
  string local_50;
  
  p_Var2 = (other->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = other;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(other->data)._M_t._M_impl.super__Rb_tree_header) {
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
      ::clear(&(local_58->data)._M_t);
      return;
    }
    __k = p_Var2 + 1;
    iVar1 = ::std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
            ::find(&(this->data)._M_t,(key_type *)__k);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->data)._M_t._M_impl.super__Rb_tree_header) break;
    this_00 = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)::std::
                 map<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
                 ::operator[](&this->data,(key_type *)__k);
    ::std::
    __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
    ::operator=(this_00,(__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                         *)&p_Var2[1]._M_parent);
    p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "BatchedDataCollection::Merge error - batch index %d is present in both collections. This occurs when batch indexes are not uniquely distributed over threads"
             ,&local_59);
  InternalException::InternalException<unsigned_long>(this_01,&local_50,*(unsigned_long *)__k);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BatchedDataCollection::Merge(BatchedDataCollection &other) {
	for (auto &entry : other.data) {
		if (data.find(entry.first) != data.end()) {
			throw InternalException(
			    "BatchedDataCollection::Merge error - batch index %d is present in both collections. This occurs when "
			    "batch indexes are not uniquely distributed over threads",
			    entry.first);
		}
		data[entry.first] = std::move(entry.second);
	}
	other.data.clear();
}